

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebmol_extrap_vel_to_faces_box.cpp
# Opt level: O0

void EBMOL::ExtrapVelToFacesBox
               (Box *ubx,Box *vbx,Box *wbx,Array4<double> *u,Array4<double> *v,Array4<double> *w,
               Array4<const_double> *vcc,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *fcx,Array4<const_double> *fcy,Array4<const_double> *fcz,
               Array4<const_double> *ccc,Array4<const_double> *vfrac,Geometry *geom,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *d_bcrec)

{
  int iVar1;
  void *in_RCX;
  Box *in_RDX;
  Box *in_RSI;
  Box *in_RDI;
  void *in_R8;
  void *in_R9;
  void *in_stack_00000008;
  void *in_stack_00000010;
  void *in_stack_00000018;
  void *in_stack_00000020;
  void *in_stack_00000028;
  void *in_stack_00000030;
  void *in_stack_00000038;
  Geometry *in_stack_00000040;
  undefined8 in_stack_00000050;
  bool has_extdir_or_ho_hi_z_for_w;
  bool has_extdir_or_ho_lo_z_for_w;
  pair<bool,_bool> extdir_lohi_z_for_w;
  bool has_extdir_or_ho_hi_y_for_w;
  bool has_extdir_or_ho_lo_y_for_w;
  pair<bool,_bool> extdir_lohi_y_for_w;
  bool has_extdir_or_ho_hi_x_for_w;
  bool has_extdir_or_ho_lo_x_for_w;
  pair<bool,_bool> extdir_lohi_x_for_w;
  int n_for_zbc;
  bool has_extdir_or_ho_hi_z_for_v;
  bool has_extdir_or_ho_lo_z_for_v;
  pair<bool,_bool> extdir_lohi_z_for_v;
  bool has_extdir_or_ho_hi_y_for_v;
  bool has_extdir_or_ho_lo_y_for_v;
  pair<bool,_bool> extdir_lohi_y_for_v;
  bool has_extdir_or_ho_hi_x_for_v;
  bool has_extdir_or_ho_lo_x_for_v;
  pair<bool,_bool> extdir_lohi_x_for_v;
  int n_for_ybc;
  bool has_extdir_or_ho_hi_z_for_u;
  bool has_extdir_or_ho_lo_z_for_u;
  pair<bool,_bool> extdir_lohi_z_for_u;
  bool has_extdir_or_ho_hi_y_for_u;
  bool has_extdir_or_ho_lo_y_for_u;
  pair<bool,_bool> extdir_lohi_y_for_u;
  bool has_extdir_or_ho_hi_x_for_u;
  bool has_extdir_or_ho_lo_x_for_u;
  pair<bool,_bool> extdir_lohi_x_for_u;
  int n_for_xbc;
  int order;
  int domain_khi;
  int domain_klo;
  int domain_jhi;
  int domain_jlo;
  int domain_ihi;
  int domain_ilo;
  Box *domain_box;
  int in_stack_fffffffffffff1b8;
  int iVar2;
  int in_stack_fffffffffffff1bc;
  undefined4 in_stack_fffffffffffff1c0;
  undefined4 in_stack_fffffffffffff1c4;
  undefined1 local_e00 [8];
  anon_class_552_16_5c7b231c *in_stack_fffffffffffff208;
  Box *in_stack_fffffffffffff210;
  undefined1 auStack_dc0 [64];
  undefined1 auStack_d80 [64];
  undefined1 auStack_d40 [64];
  undefined1 auStack_d00 [64];
  undefined1 auStack_cc0 [64];
  undefined1 auStack_c80 [64];
  undefined1 auStack_c40 [64];
  undefined4 local_c00;
  undefined8 local_bf8;
  int local_bf0;
  int local_bec;
  undefined8 local_be4;
  undefined8 local_bdc;
  undefined8 local_bd4;
  uint local_bcc;
  undefined1 local_bc8 [64];
  undefined1 auStack_b88 [64];
  undefined1 auStack_b48 [64];
  undefined1 auStack_b08 [64];
  undefined1 auStack_ac8 [64];
  undefined8 local_a88;
  undefined1 auStack_a80 [64];
  undefined1 auStack_a40 [64];
  undefined1 auStack_a00 [64];
  int local_9c0;
  int local_9bc;
  int local_9b8;
  int local_9b4;
  int local_9b0;
  int local_9ac;
  undefined4 local_9a8;
  undefined8 local_99c;
  undefined8 local_994;
  undefined8 local_98c;
  uint local_984;
  byte local_980;
  byte local_97f;
  pair<bool,_bool> local_97e;
  byte local_97c;
  byte local_97b;
  pair<bool,_bool> local_97a;
  byte local_978;
  byte local_977;
  pair<bool,_bool> local_976;
  undefined4 local_974;
  undefined1 local_970 [64];
  undefined1 auStack_930 [64];
  undefined1 auStack_8f0 [64];
  undefined1 auStack_8b0 [64];
  undefined1 auStack_870 [64];
  undefined1 auStack_830 [64];
  undefined1 auStack_7f0 [64];
  undefined1 auStack_7b0 [64];
  undefined4 local_770;
  undefined8 local_768;
  int local_760;
  int local_75c;
  undefined8 local_754;
  undefined8 local_74c;
  undefined8 local_744;
  uint local_73c;
  undefined1 local_738 [64];
  undefined1 auStack_6f8 [64];
  undefined1 auStack_6b8 [64];
  undefined1 auStack_678 [64];
  undefined1 auStack_638 [64];
  undefined8 local_5f8;
  undefined1 auStack_5f0 [64];
  undefined1 auStack_5b0 [64];
  undefined1 auStack_570 [64];
  int local_530;
  int local_52c;
  int local_528;
  int local_524;
  int local_520;
  int local_51c;
  undefined4 local_518;
  undefined8 local_50c;
  undefined8 local_504;
  undefined8 local_4fc;
  uint local_4f4;
  byte local_4f0;
  byte local_4ef;
  pair<bool,_bool> local_4ee;
  byte local_4ec;
  byte local_4eb;
  pair<bool,_bool> local_4ea;
  byte local_4e8;
  byte local_4e7;
  pair<bool,_bool> local_4e6;
  undefined4 local_4e4;
  undefined1 local_4e0 [64];
  undefined1 auStack_4a0 [64];
  undefined1 auStack_460 [64];
  undefined1 auStack_420 [64];
  undefined1 auStack_3e0 [64];
  undefined1 auStack_3a0 [64];
  undefined1 auStack_360 [64];
  undefined1 auStack_320 [64];
  undefined4 local_2e0;
  undefined8 local_2d8;
  int local_2d0;
  int local_2cc;
  undefined8 local_2c4;
  undefined8 local_2bc;
  undefined8 local_2b4;
  uint local_2ac;
  undefined1 local_2a8 [64];
  undefined1 auStack_268 [64];
  undefined1 auStack_228 [64];
  undefined1 auStack_1e8 [64];
  undefined1 auStack_1a8 [64];
  undefined8 local_168;
  undefined1 auStack_160 [64];
  undefined1 auStack_120 [64];
  undefined1 auStack_e0 [64];
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined4 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  uint local_68;
  byte local_64;
  byte local_63;
  pair<bool,_bool> local_62;
  byte local_60;
  byte local_5f;
  pair<bool,_bool> local_5e;
  byte local_5c;
  byte local_5b;
  pair<bool,_bool> local_5a;
  undefined4 local_58;
  undefined4 local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  Box *local_38;
  void *local_30;
  void *local_28;
  void *local_20;
  Box *local_18;
  Box *local_10;
  Box *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_38 = amrex::Geometry::Domain(in_stack_00000040);
  local_3c = amrex::Box::smallEnd(local_38,0);
  local_40 = amrex::Box::bigEnd(local_38,0);
  local_44 = amrex::Box::smallEnd(local_38,1);
  local_48 = amrex::Box::bigEnd(local_38,1);
  local_4c = amrex::Box::smallEnd(local_38,2);
  local_50 = amrex::Box::bigEnd(local_38,2);
  local_54 = 2;
  local_58 = 0;
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xb55b0f);
  local_5a = anon_unknown.dwarf_73a036::has_extdir_or_ho
                       ((BCRec *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                        in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8);
  local_5b = local_5a.first & 1;
  local_5c = local_5a.second & 1;
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xb55b55);
  local_5e = anon_unknown.dwarf_73a036::has_extdir_or_ho
                       ((BCRec *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                        in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8);
  local_5f = local_5e.first & 1;
  local_60 = local_5e.second & 1;
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xb55b9e);
  local_62 = anon_unknown.dwarf_73a036::has_extdir_or_ho
                       ((BCRec *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                        in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8);
  iVar2 = local_3c;
  local_63 = local_62.first & 1;
  local_64 = local_62.second & 1;
  if ((local_5b & 1) == 0) {
LAB_00b55c0f:
    iVar2 = local_40;
    if ((local_5c & 1) != 0) {
      iVar1 = amrex::Box::bigEnd(local_8,0);
      if (iVar2 <= iVar1) goto LAB_00b55d17;
    }
    iVar2 = local_44;
    if ((local_5f & 1) != 0) {
      iVar1 = amrex::Box::smallEnd(local_10,1);
      if (iVar1 + -1 <= iVar2) goto LAB_00b55d17;
    }
    iVar2 = local_48;
    if ((local_60 & 1) != 0) {
      iVar1 = amrex::Box::bigEnd(local_10,1);
      if (iVar2 <= iVar1) goto LAB_00b55d17;
    }
    iVar2 = local_4c;
    if ((local_63 & 1) != 0) {
      iVar1 = amrex::Box::smallEnd(local_18,2);
      if (iVar1 + -1 <= iVar2) goto LAB_00b55d17;
    }
    iVar2 = local_50;
    if ((local_64 & 1) != 0) {
      iVar1 = amrex::Box::bigEnd(local_18,2);
      if (iVar2 <= iVar1) goto LAB_00b55d17;
    }
    local_2c4 = *(undefined8 *)(local_8->smallend).vect;
    local_2bc = *(undefined8 *)((local_8->smallend).vect + 2);
    local_2b4 = *(undefined8 *)((local_8->bigend).vect + 1);
    local_2ac = (local_8->btype).itype;
    memcpy(local_4e0,local_20,0x3c);
    memcpy(auStack_4a0,in_stack_00000008,0x3c);
    memcpy(auStack_460,in_stack_00000010,0x3c);
    memcpy(auStack_420,in_stack_00000018,0x3c);
    memcpy(auStack_3e0,in_stack_00000020,0x3c);
    memcpy(auStack_3a0,in_stack_00000028,0x3c);
    memcpy(auStack_360,in_stack_00000030,0x3c);
    memcpy(auStack_320,in_stack_00000038,0x3c);
    local_2e0 = local_54;
    local_2d8 = in_stack_00000050;
    local_2d0 = local_3c;
    local_2cc = local_40;
    amrex::
    ParallelFor<EBMOL::ExtrapVelToFacesBox(amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*)::__1>
              (in_stack_fffffffffffff210,(anon_class_536_12_3004486f *)in_stack_fffffffffffff208);
  }
  else {
    iVar1 = amrex::Box::smallEnd(local_8,0);
    if (iVar2 < iVar1 + -1) goto LAB_00b55c0f;
LAB_00b55d17:
    local_80 = *(undefined8 *)(local_8->smallend).vect;
    local_78 = *(undefined8 *)((local_8->smallend).vect + 2);
    local_70 = *(undefined8 *)((local_8->bigend).vect + 1);
    local_68 = (local_8->btype).itype;
    memcpy(local_2a8,local_20,0x3c);
    memcpy(auStack_268,in_stack_00000008,0x3c);
    memcpy(auStack_228,in_stack_00000010,0x3c);
    memcpy(auStack_1e8,in_stack_00000030,0x3c);
    memcpy(auStack_1a8,in_stack_00000038,0x3c);
    local_168 = in_stack_00000050;
    memcpy(auStack_160,in_stack_00000018,0x3c);
    memcpy(auStack_120,in_stack_00000020,0x3c);
    memcpy(auStack_e0,in_stack_00000028,0x3c);
    local_a0 = local_3c;
    local_9c = local_44;
    local_98 = local_4c;
    local_94 = local_40;
    local_90 = local_48;
    local_8c = local_50;
    local_88 = local_54;
    amrex::
    ParallelFor<EBMOL::ExtrapVelToFacesBox(amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*)::__0>
              (in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  }
  local_4e4 = 1;
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xb56070);
  local_4e6 = anon_unknown.dwarf_73a036::has_extdir_or_ho
                        ((BCRec *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                         in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8);
  local_4e7 = local_4e6.first & 1;
  local_4e8 = local_4e6.second & 1;
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xb560b6);
  local_4ea = anon_unknown.dwarf_73a036::has_extdir_or_ho
                        ((BCRec *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                         in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8);
  local_4eb = local_4ea.first & 1;
  local_4ec = local_4ea.second & 1;
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xb560ff);
  local_4ee = anon_unknown.dwarf_73a036::has_extdir_or_ho
                        ((BCRec *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                         in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8);
  iVar2 = local_3c;
  local_4ef = local_4ee.first & 1;
  local_4f0 = local_4ee.second & 1;
  if ((local_4e7 & 1) == 0) {
LAB_00b56170:
    iVar2 = local_40;
    if ((local_4e8 & 1) != 0) {
      iVar1 = amrex::Box::bigEnd(local_8,0);
      if (iVar2 <= iVar1) goto LAB_00b56278;
    }
    iVar2 = local_44;
    if ((local_4eb & 1) != 0) {
      iVar1 = amrex::Box::smallEnd(local_10,1);
      if (iVar1 + -1 <= iVar2) goto LAB_00b56278;
    }
    iVar2 = local_48;
    if ((local_4ec & 1) != 0) {
      iVar1 = amrex::Box::bigEnd(local_10,1);
      if (iVar2 <= iVar1) goto LAB_00b56278;
    }
    iVar2 = local_4c;
    if ((local_4ef & 1) != 0) {
      iVar1 = amrex::Box::smallEnd(local_18,2);
      if (iVar1 + -1 <= iVar2) goto LAB_00b56278;
    }
    iVar2 = local_50;
    if ((local_4f0 & 1) != 0) {
      iVar1 = amrex::Box::bigEnd(local_18,2);
      if (iVar2 <= iVar1) goto LAB_00b56278;
    }
    local_754 = *(undefined8 *)(local_10->smallend).vect;
    local_74c = *(undefined8 *)((local_10->smallend).vect + 2);
    local_744 = *(undefined8 *)((local_10->bigend).vect + 1);
    local_73c = (local_10->btype).itype;
    memcpy(local_970,local_28,0x3c);
    memcpy(auStack_930,in_stack_00000008,0x3c);
    memcpy(auStack_8f0,in_stack_00000010,0x3c);
    memcpy(auStack_8b0,in_stack_00000018,0x3c);
    memcpy(auStack_870,in_stack_00000020,0x3c);
    memcpy(auStack_830,in_stack_00000028,0x3c);
    memcpy(auStack_7f0,in_stack_00000030,0x3c);
    memcpy(auStack_7b0,in_stack_00000038,0x3c);
    local_770 = local_54;
    local_768 = in_stack_00000050;
    local_760 = local_44;
    local_75c = local_48;
    amrex::
    ParallelFor<EBMOL::ExtrapVelToFacesBox(amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*)::__3>
              (in_stack_fffffffffffff210,(anon_class_536_12_37b665ee *)in_stack_fffffffffffff208);
  }
  else {
    iVar1 = amrex::Box::smallEnd(local_8,0);
    if (iVar2 < iVar1 + -1) goto LAB_00b56170;
LAB_00b56278:
    local_50c = *(undefined8 *)(local_10->smallend).vect;
    local_504 = *(undefined8 *)((local_10->smallend).vect + 2);
    local_4fc = *(undefined8 *)((local_10->bigend).vect + 1);
    local_4f4 = (local_10->btype).itype;
    memcpy(local_738,local_28,0x3c);
    memcpy(auStack_6f8,in_stack_00000008,0x3c);
    memcpy(auStack_6b8,in_stack_00000010,0x3c);
    memcpy(auStack_678,in_stack_00000030,0x3c);
    memcpy(auStack_638,in_stack_00000038,0x3c);
    local_5f8 = in_stack_00000050;
    memcpy(auStack_5f0,in_stack_00000018,0x3c);
    memcpy(auStack_5b0,in_stack_00000020,0x3c);
    memcpy(auStack_570,in_stack_00000028,0x3c);
    local_530 = local_3c;
    local_52c = local_44;
    local_528 = local_4c;
    local_524 = local_40;
    local_520 = local_48;
    local_51c = local_50;
    local_518 = local_54;
    amrex::
    ParallelFor<EBMOL::ExtrapVelToFacesBox(amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*)::__2>
              (in_stack_fffffffffffff210,(anon_class_552_16_3e0d00fb *)in_stack_fffffffffffff208);
  }
  local_974 = 2;
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xb565d1);
  local_976 = anon_unknown.dwarf_73a036::has_extdir_or_ho
                        ((BCRec *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                         in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8);
  local_977 = local_976.first & 1;
  local_978 = local_976.second & 1;
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xb56617);
  local_97a = anon_unknown.dwarf_73a036::has_extdir_or_ho
                        ((BCRec *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                         in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8);
  local_97b = local_97a.first & 1;
  local_97c = local_97a.second & 1;
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xb56660);
  local_97e = anon_unknown.dwarf_73a036::has_extdir_or_ho
                        ((BCRec *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                         in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8);
  iVar2 = local_3c;
  local_97f = local_97e.first & 1;
  local_980 = local_97e.second & 1;
  if ((local_977 & 1) == 0) {
LAB_00b566d1:
    iVar2 = local_40;
    if ((local_978 & 1) != 0) {
      iVar1 = amrex::Box::bigEnd(local_8,0);
      if (iVar2 <= iVar1) goto LAB_00b567d7;
    }
    if ((local_97b & 1) != 0) {
      iVar2 = local_44;
      iVar1 = amrex::Box::smallEnd(local_10,1);
      if (iVar1 + -1 <= iVar2) goto LAB_00b567d7;
    }
    if ((local_97c & 1) != 0) {
      iVar2 = local_48;
      iVar1 = amrex::Box::bigEnd(local_10,1);
      if (iVar2 <= iVar1) goto LAB_00b567d7;
    }
    if ((local_97f & 1) != 0) {
      iVar2 = local_4c;
      iVar1 = amrex::Box::smallEnd(local_18,2);
      if (iVar1 + -1 <= iVar2) goto LAB_00b567d7;
    }
    if ((local_980 & 1) != 0) {
      iVar2 = local_50;
      iVar1 = amrex::Box::bigEnd(local_18,2);
      if (iVar2 <= iVar1) goto LAB_00b567d7;
    }
    local_be4 = *(undefined8 *)(local_18->smallend).vect;
    local_bdc = *(undefined8 *)((local_18->smallend).vect + 2);
    local_bd4 = *(undefined8 *)((local_18->bigend).vect + 1);
    local_bcc = (local_18->btype).itype;
    memcpy(local_e00,local_30,0x3c);
    memcpy(auStack_dc0,in_stack_00000008,0x3c);
    memcpy(auStack_d80,in_stack_00000010,0x3c);
    memcpy(auStack_d40,in_stack_00000018,0x3c);
    memcpy(auStack_d00,in_stack_00000020,0x3c);
    memcpy(auStack_cc0,in_stack_00000028,0x3c);
    memcpy(auStack_c80,in_stack_00000030,0x3c);
    memcpy(auStack_c40,in_stack_00000038,0x3c);
    local_c00 = local_54;
    local_bf8 = in_stack_00000050;
    local_bf0 = local_4c;
    local_bec = local_50;
    amrex::
    ParallelFor<EBMOL::ExtrapVelToFacesBox(amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*)::__5>
              (in_stack_fffffffffffff210,(anon_class_536_12_3f68836d *)in_stack_fffffffffffff208);
  }
  else {
    iVar1 = amrex::Box::smallEnd(local_8,0);
    if (iVar2 < iVar1 + -1) goto LAB_00b566d1;
LAB_00b567d7:
    local_99c = *(undefined8 *)(local_18->smallend).vect;
    local_994 = *(undefined8 *)((local_18->smallend).vect + 2);
    local_98c = *(undefined8 *)((local_18->bigend).vect + 1);
    local_984 = (local_18->btype).itype;
    memcpy(local_bc8,local_30,0x3c);
    memcpy(auStack_b88,in_stack_00000008,0x3c);
    memcpy(auStack_b48,in_stack_00000010,0x3c);
    memcpy(auStack_b08,in_stack_00000030,0x3c);
    memcpy(auStack_ac8,in_stack_00000038,0x3c);
    local_a88 = in_stack_00000050;
    memcpy(auStack_a80,in_stack_00000018,0x3c);
    memcpy(auStack_a40,in_stack_00000020,0x3c);
    memcpy(auStack_a00,in_stack_00000028,0x3c);
    local_9c0 = local_3c;
    local_9bc = local_40;
    local_9b8 = local_44;
    local_9b4 = local_48;
    local_9b0 = local_4c;
    local_9ac = local_50;
    local_9a8 = local_54;
    amrex::
    ParallelFor<EBMOL::ExtrapVelToFacesBox(amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*)::__4>
              (in_stack_fffffffffffff210,(anon_class_552_16_a6c64e1e *)in_stack_fffffffffffff208);
  }
  return;
}

Assistant:

void
EBMOL::ExtrapVelToFacesBox ( AMREX_D_DECL( Box const& ubx,
                                           Box const& vbx,
                                           Box const& wbx ),
                             AMREX_D_DECL( Array4<Real> const& u,
                                           Array4<Real> const& v,
                                           Array4<Real> const& w ),
                             Array4<Real const> const& vcc,
                             Array4<EBCellFlag const> const& flag,
                             AMREX_D_DECL( Array4<Real const> const& fcx,
                                           Array4<Real const> const& fcy,
                                           Array4<Real const> const& fcz ),
                             Array4<Real const> const& ccc,
                             Array4<Real const> const& vfrac,
                             const Geometry&  geom,
                             Vector<BCRec> const& h_bcrec,
                             const BCRec* d_bcrec )
{

    const Box& domain_box = geom.Domain();
    AMREX_D_TERM(
        const int domain_ilo = domain_box.smallEnd(0);
        const int domain_ihi = domain_box.bigEnd(0);,
        const int domain_jlo = domain_box.smallEnd(1);
        const int domain_jhi = domain_box.bigEnd(1);,
        const int domain_klo = domain_box.smallEnd(2);
        const int domain_khi = domain_box.bigEnd(2););

    int order = 2;

    // ****************************************************************************
    // Decide whether the stencil at each cell might need to see values that
    //     live on face centroids rather than cell centroids, i.e.
    //     are at a domain boundary with ext_dir or hoextrap boundary conditions
    // ****************************************************************************


    int n_for_xbc = 0;

    auto extdir_lohi_x_for_u = has_extdir_or_ho(h_bcrec.data(), n_for_xbc, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo_x_for_u = extdir_lohi_x_for_u.first;
    bool has_extdir_or_ho_hi_x_for_u = extdir_lohi_x_for_u.second;

    auto extdir_lohi_y_for_u = has_extdir_or_ho(h_bcrec.data(), n_for_xbc, static_cast<int>(Direction::y));
    bool has_extdir_or_ho_lo_y_for_u = extdir_lohi_y_for_u.first;
    bool has_extdir_or_ho_hi_y_for_u = extdir_lohi_y_for_u.second;

#if (AMREX_SPACEDIM == 3)
    auto extdir_lohi_z_for_u = has_extdir_or_ho(h_bcrec.data(), n_for_xbc, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z_for_u = extdir_lohi_z_for_u.first;
    bool has_extdir_or_ho_hi_z_for_u = extdir_lohi_z_for_u.second;
#endif



    // ****************************************************************************
    // Predict to x-faces
    // ****************************************************************************
    if ((has_extdir_or_ho_lo_x_for_u && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi_x_for_u && domain_ihi <= ubx.bigEnd(0)    ) ||
        (has_extdir_or_ho_lo_y_for_u && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi_y_for_u && domain_jhi <= vbx.bigEnd(1)    )
#if (AMREX_SPACEDIM == 2)
        )
#elif (AMREX_SPACEDIM == 3)
        ||
        (has_extdir_or_ho_lo_z_for_u && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi_z_for_u && domain_khi <= wbx.bigEnd(2)    ) )
#endif
    {
        amrex::ParallelFor(Box(ubx),
        [u,vcc,flag,ccc,vfrac,d_bcrec,
         AMREX_D_DECL(fcx,fcy,fcz),
         AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
         AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
         order]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real u_val(0);

            AMREX_D_TERM(bool extdir_or_ho_ilo = (d_bcrec[0].lo(0) == BCType::ext_dir) ||
                                                 (d_bcrec[0].lo(0) == BCType::hoextrap);,
                         bool extdir_or_ho_jlo = (d_bcrec[0].lo(1) == BCType::ext_dir) ||
                                                 (d_bcrec[0].lo(1) == BCType::hoextrap);,
                         bool extdir_or_ho_klo = (d_bcrec[0].lo(2) == BCType::ext_dir) ||
                                                 (d_bcrec[0].lo(2) == BCType::hoextrap););

            AMREX_D_TERM(bool extdir_or_ho_ihi = (d_bcrec[0].hi(0) == BCType::ext_dir) ||
                                                 (d_bcrec[0].hi(0) == BCType::hoextrap);,
                         bool extdir_or_ho_jhi = (d_bcrec[0].hi(1) == BCType::ext_dir) ||
                                                 (d_bcrec[0].hi(1) == BCType::hoextrap);,
                         bool extdir_or_ho_khi = (d_bcrec[0].hi(2) == BCType::ext_dir) ||
                                                 (d_bcrec[0].hi(2) == BCType::hoextrap););

            if (flag(i,j,k).isConnected(-1,0,0))
            {
               Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
               Real zf = fcx(i,j,k,1);
#endif
               AMREX_D_TERM(Real delta_x = 0.5 + ccc(i,j,k,0);,
                            Real delta_y = yf  - ccc(i,j,k,1);,
                            Real delta_z = zf  - ccc(i,j,k,2););

               Real vcc_mns = vcc(i-1,j,k,0);
               Real vcc_pls = vcc(i,j,k,0);

               Real cc_umax = amrex::max(vcc_pls, vcc_mns);
               Real cc_umin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "0" of vcc
               const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,0,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

#if (AMREX_SPACEDIM == 3)
               Real upls = vcc_pls - delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1]
                                   + delta_z * slopes_eb_hi[2];
#else
               Real upls = vcc_pls - delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1];
#endif
               upls = amrex::max(amrex::min(upls, cc_umax), cc_umin);

               AMREX_D_TERM(delta_x = 0.5 - ccc(i-1,j,k,0);,
                            delta_y = yf  - ccc(i-1,j,k,1);,
                            delta_z = zf  - ccc(i-1,j,k,2););

               // Compute slopes of component "0" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i-1,j,k,0,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

#if (AMREX_SPACEDIM == 3)
               Real umns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];
#else
               Real umns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1];
#endif
               umns = amrex::max(amrex::min(umns, cc_umax), cc_umin);

               HydroBC::SetXEdgeBCs(i, j, k, 0, vcc, umns, upls, d_bcrec[0].lo(0), domain_ilo, d_bcrec[0].hi(0), domain_ihi, true);

               if ( (i==domain_ilo) && (d_bcrec[0].lo(0) == BCType::foextrap || d_bcrec[0].lo(0) == BCType::hoextrap) )
               {
                   upls = amrex::min(upls,0.0_rt);
                   umns = upls;
               }
               if ( (i==domain_ihi+1) && (d_bcrec[0].hi(0) == BCType::foextrap || d_bcrec[0].hi(0) == BCType::hoextrap) )
               {
                    umns = amrex::max(umns,0.0_rt);
                    upls = umns;
               }

               if ( umns >= 0.0 || upls <= 0.0 ) {
                  Real avg = 0.5 * ( upls + umns );

                  if (avg >= small_vel) {
                    u_val = umns;
                  }
                  else if (avg <= -small_vel) {
                    u_val = upls;
                  }
               }

               if (i == domain_ilo && (d_bcrec[0].lo(0) == BCType::ext_dir)) {
                   u_val = vcc_mns;
               } else if (i == domain_ihi+1 && (d_bcrec[0].hi(0) == BCType::ext_dir)) {
                   u_val = vcc_pls;
               }
            }

            u(i,j,k) = u_val;
        });
    }
    else
    {
        amrex::ParallelFor(Box(ubx),
        [u,vcc,flag,AMREX_D_DECL(fcx,fcy,fcz),ccc,vfrac,order,d_bcrec,domain_ilo,domain_ihi]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real u_val(0);

            if (flag(i,j,k).isConnected(-1,0,0))
            {
               Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
               Real zf = fcx(i,j,k,1);
#endif

               AMREX_D_TERM(Real delta_x = 0.5 + ccc(i,j,k,0);,
                            Real delta_y = yf  - ccc(i,j,k,1);,
                            Real delta_z = zf  - ccc(i,j,k,2););

               const Real vcc_mns = vcc(i-1,j,k,0);
               const Real vcc_pls = vcc(i,j,k,0);

               Real cc_umax = amrex::max(vcc_pls, vcc_mns);
               Real cc_umin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "0" of vcc
               const auto slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,0,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

#if (AMREX_SPACEDIM == 3)
               Real upls = vcc_pls - delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1]
                                   + delta_z * slopes_eb_hi[2];
#else
               Real upls = vcc_pls - delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1];
#endif
               upls = amrex::max(amrex::min(upls, cc_umax), cc_umin);

               AMREX_D_TERM(delta_x = 0.5 - ccc(i-1,j,k,0);,
                            delta_y = yf  - ccc(i-1,j,k,1);,
                            delta_z = zf  - ccc(i-1,j,k,2););

               // Compute slopes of component "0" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_eb(i-1,j,k,0,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

#if (AMREX_SPACEDIM == 3)
               Real umns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];
#else
               Real umns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1];
#endif
               umns = amrex::max(amrex::min(umns, cc_umax), cc_umin);

               HydroBC::SetXEdgeBCs(i, j, k, 0, vcc, umns, upls, d_bcrec[0].lo(0), domain_ilo, d_bcrec[0].hi(0), domain_ihi, true);

               if ( (i==domain_ilo) && (d_bcrec[0].lo(0) == BCType::foextrap || d_bcrec[0].lo(0) == BCType::hoextrap) )
               {
                   upls = amrex::min(upls,0.0_rt);
                   umns = upls;
               }
               if ( (i==domain_ihi+1) && (d_bcrec[0].hi(0) == BCType::foextrap || d_bcrec[0].hi(0) == BCType::hoextrap) )
               {
                    umns = amrex::max(umns,0.0_rt);
                    upls = umns;
               }

               if ( umns >= 0.0 || upls <= 0.0 ) {
                  Real avg = 0.5 * ( upls + umns );

                  if (avg >= small_vel) {
                    u_val = umns;
                  }
                  else if (avg <= -small_vel) {
                    u_val = upls;
                  }
               }
            }

            u(i,j,k) = u_val;
        });
    }

    // ****************************************************************************
    // Predict to y-faces
    // ****************************************************************************

    int n_for_ybc = 1;

    auto extdir_lohi_x_for_v = has_extdir_or_ho(h_bcrec.data(), n_for_ybc, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo_x_for_v = extdir_lohi_x_for_v.first;
    bool has_extdir_or_ho_hi_x_for_v = extdir_lohi_x_for_v.second;

    auto extdir_lohi_y_for_v = has_extdir_or_ho(h_bcrec.data(), n_for_ybc, static_cast<int>(Direction::y));
    bool has_extdir_or_ho_lo_y_for_v = extdir_lohi_y_for_v.first;
    bool has_extdir_or_ho_hi_y_for_v = extdir_lohi_y_for_v.second;

#if (AMREX_SPACEDIM == 3)
    auto extdir_lohi_z_for_v = has_extdir_or_ho(h_bcrec.data(), n_for_ybc, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z_for_v = extdir_lohi_z_for_v.first;
    bool has_extdir_or_ho_hi_z_for_v = extdir_lohi_z_for_v.second;
#endif

    if ((has_extdir_or_ho_lo_x_for_v && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi_x_for_v && domain_ihi <= ubx.bigEnd(0)    ) ||
        (has_extdir_or_ho_lo_y_for_v && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi_y_for_v && domain_jhi <= vbx.bigEnd(1)    )
#if (AMREX_SPACEDIM == 2)
        )
#elif (AMREX_SPACEDIM == 3)
        ||
        (has_extdir_or_ho_lo_z_for_v && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi_z_for_v && domain_khi <= wbx.bigEnd(2)    ) )
#endif
    {
        amrex::ParallelFor(Box(vbx),
        [v,vcc,flag,ccc,vfrac,d_bcrec,
         AMREX_D_DECL(fcx,fcy,fcz),
         AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
         AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
         order]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real v_val(0);

            AMREX_D_TERM(bool extdir_or_ho_ilo = (d_bcrec[1].lo(0) == BCType::ext_dir) ||
                                                 (d_bcrec[1].lo(0) == BCType::hoextrap);,
                         bool extdir_or_ho_jlo = (d_bcrec[1].lo(1) == BCType::ext_dir) ||
                                                 (d_bcrec[1].lo(1) == BCType::hoextrap);,
                         bool extdir_or_ho_klo = (d_bcrec[1].lo(2) == BCType::ext_dir) ||
                                                 (d_bcrec[1].lo(2) == BCType::hoextrap););

            AMREX_D_TERM(bool extdir_or_ho_ihi = (d_bcrec[1].hi(0) == BCType::ext_dir) ||
                                                 (d_bcrec[1].hi(0) == BCType::hoextrap);,
                         bool extdir_or_ho_jhi = (d_bcrec[1].hi(1) == BCType::ext_dir) ||
                                                 (d_bcrec[1].hi(1) == BCType::hoextrap);,
                         bool extdir_or_ho_khi = (d_bcrec[1].hi(2) == BCType::ext_dir) ||
                                                 (d_bcrec[1].hi(2) == BCType::hoextrap););

            if (flag(i,j,k).isConnected(0,-1,0))
            {
               Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
               Real zf = fcy(i,j,k,1);
#endif

               AMREX_D_TERM(Real delta_x = xf  - ccc(i,j,k,0);,
                            Real delta_y = 0.5 + ccc(i,j,k,1);,
                            Real delta_z = zf  - ccc(i,j,k,2););

               const Real vcc_mns = vcc(i,j-1,k,1);
               const Real vcc_pls = vcc(i,j,k,1);

               Real cc_vmax = amrex::max(vcc_pls, vcc_mns);
               Real cc_vmin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "1" of vcc
               const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,1,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

#if (AMREX_SPACEDIM == 3)
               Real vpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   - delta_y * slopes_eb_hi[1]
                                   + delta_z * slopes_eb_hi[2];
#else
               Real vpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   - delta_y * slopes_eb_hi[1];
#endif

               vpls = amrex::max(amrex::min(vpls, cc_vmax), cc_vmin);

               AMREX_D_TERM(delta_x = xf  - ccc(i,j-1,k,0);,
                            delta_y = 0.5 - ccc(i,j-1,k,1);,
                            delta_z = zf  - ccc(i,j-1,k,2););

               // Compute slopes of component "1" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j-1,k,1,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

#if (AMREX_SPACEDIM == 3)
               Real vmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];
#else
               Real vmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1];
#endif

               vmns = amrex::max(amrex::min(vmns, cc_vmax), cc_vmin);

               HydroBC::SetYEdgeBCs(i, j, k, 1, vcc, vmns, vpls, d_bcrec[1].lo(1), domain_jlo, d_bcrec[1].hi(1), domain_jhi, true);

               if ( (j==domain_jlo) && (d_bcrec[1].lo(1) == BCType::foextrap || d_bcrec[1].lo(1) == BCType::hoextrap) )
               {
                   vpls = amrex::min(vpls,0.0_rt);
                   vmns = vpls;
               }
               if ( (j==domain_jhi+1) && (d_bcrec[1].hi(1) == BCType::foextrap || d_bcrec[1].hi(1) == BCType::hoextrap) )
               {
                    vmns = amrex::max(vmns,0.0_rt);
                    vpls = vmns;
               }

               if ( vmns >= 0.0 || vpls <= 0.0_rt ) {
                  Real avg = 0.5 * ( vpls + vmns );

                  if (avg >= small_vel) {
                    v_val = vmns;
                  }
                  else if (avg <= -small_vel) {
                    v_val = vpls;
                  }
               }

               if (j == domain_jlo && (d_bcrec[1].lo(1) == BCType::ext_dir)) {
                   v_val = vcc_mns;
               }
               else if (j == domain_jhi+1 && (d_bcrec[1].hi(1) == BCType::ext_dir)) {
                   v_val = vcc_pls;
               }
            }

            v(i,j,k) = v_val;
        });
    }
    else
    {
        amrex::ParallelFor(Box(vbx),
        [v,vcc,flag,AMREX_D_DECL(fcx,fcy,fcz),ccc,vfrac,order,d_bcrec,domain_jlo,domain_jhi]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real v_val(0);

            if (flag(i,j,k).isConnected(0,-1,0))
            {
               Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
               Real zf = fcy(i,j,k,1);
#endif

               AMREX_D_TERM(Real delta_x = xf  - ccc(i,j,k,0);,
                            Real delta_y = 0.5 + ccc(i,j,k,1);,
                            Real delta_z = zf  - ccc(i,j,k,2););

               const Real vcc_mns = vcc(i,j-1,k,1);
               const Real vcc_pls = vcc(i,j,k,1);

               Real cc_vmax = amrex::max(vcc_pls, vcc_mns);
               Real cc_vmin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "1" of vcc
               const auto slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,1,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

#if (AMREX_SPACEDIM == 3)
               Real vpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   - delta_y * slopes_eb_hi[1]
                                   + delta_z * slopes_eb_hi[2];
#else
               Real vpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   - delta_y * slopes_eb_hi[1];
#endif

               vpls = amrex::max(amrex::min(vpls, cc_vmax), cc_vmin);

               AMREX_D_TERM(delta_x = xf  - ccc(i,j-1,k,0);,
                            delta_y = 0.5 - ccc(i,j-1,k,1);,
                            delta_z = zf  - ccc(i,j-1,k,2););

               // Compute slopes of component "1" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j-1,k,1,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

#if (AMREX_SPACEDIM == 3)
               Real vmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];
#else
               Real vmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1];
#endif

               vmns = amrex::max(amrex::min(vmns, cc_vmax), cc_vmin);

               HydroBC::SetYEdgeBCs(i, j, k, 1, vcc, vmns, vpls, d_bcrec[1].lo(1), domain_jlo, d_bcrec[1].hi(1), domain_jhi, true);

               if ( (j==domain_jlo) && (d_bcrec[1].lo(1) == BCType::foextrap || d_bcrec[1].lo(1) == BCType::hoextrap) )
               {
                   vpls = amrex::min(vpls,0.0_rt);
                   vmns = vpls;
               }
               if ( (j==domain_jhi+1) && (d_bcrec[1].hi(1) == BCType::foextrap || d_bcrec[1].hi(1) == BCType::hoextrap) )
               {
                    vmns = amrex::max(vmns,0.0_rt);
                    vpls = vmns;
               }

               if ( vmns >= 0.0 || vpls <= 0.0_rt ) {
                  Real avg = 0.5 * ( vpls + vmns );

                  if (avg >= small_vel) {
                    v_val = vmns;
                  }
                  else if (avg <= -small_vel) {
                    v_val = vpls;
                  }
               }
            }

            v(i,j,k) = v_val;
        });
    }

#if (AMREX_SPACEDIM == 3)
    // ****************************************************************************
    // Predict to z-faces
    // ****************************************************************************

    int n_for_zbc = 2;

    auto extdir_lohi_x_for_w = has_extdir_or_ho(h_bcrec.data(), n_for_zbc, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo_x_for_w = extdir_lohi_x_for_w.first;
    bool has_extdir_or_ho_hi_x_for_w = extdir_lohi_x_for_w.second;

    auto extdir_lohi_y_for_w = has_extdir_or_ho(h_bcrec.data(), n_for_zbc, static_cast<int>(Direction::y));
    bool has_extdir_or_ho_lo_y_for_w = extdir_lohi_y_for_w.first;
    bool has_extdir_or_ho_hi_y_for_w = extdir_lohi_y_for_w.second;

#if (AMREX_SPACEDIM == 3)
    auto extdir_lohi_z_for_w = has_extdir_or_ho(h_bcrec.data(), n_for_zbc, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z_for_w = extdir_lohi_z_for_w.first;
    bool has_extdir_or_ho_hi_z_for_w = extdir_lohi_z_for_w.second;
#endif

    if ((has_extdir_or_ho_lo_x_for_w && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi_x_for_w && domain_ihi <= ubx.bigEnd(0)    ) ||
        (has_extdir_or_ho_lo_y_for_w && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi_y_for_w && domain_jhi <= vbx.bigEnd(1)    )
#if (AMREX_SPACEDIM == 2)
        )
#elif (AMREX_SPACEDIM == 3)
        ||
        (has_extdir_or_ho_lo_z_for_w && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi_z_for_w && domain_khi <= wbx.bigEnd(2)    ) )
#endif
    {
        amrex::ParallelFor(Box(wbx),
        [w,vcc,flag,ccc,vfrac,d_bcrec,
         AMREX_D_DECL(fcx,fcy,fcz),
         domain_ilo,domain_ihi,domain_jlo,domain_jhi,domain_klo,domain_khi,
         order]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real w_val(0);

            bool extdir_or_ho_ilo = (d_bcrec[2].lo(0) == BCType::ext_dir) ||
                                    (d_bcrec[2].lo(0) == BCType::hoextrap);
            bool extdir_or_ho_ihi = (d_bcrec[2].hi(0) == BCType::ext_dir) ||
                                    (d_bcrec[2].hi(0) == BCType::hoextrap);

            bool extdir_or_ho_jlo = (d_bcrec[2].lo(1) == BCType::ext_dir) ||
                                    (d_bcrec[2].lo(1) == BCType::hoextrap);
            bool extdir_or_ho_jhi = (d_bcrec[2].hi(1) == BCType::ext_dir) ||
                                    (d_bcrec[2].hi(1) == BCType::hoextrap);

            bool extdir_or_ho_klo = (d_bcrec[2].lo(2) == BCType::ext_dir) ||
                                    (d_bcrec[2].lo(2) == BCType::hoextrap);
            bool extdir_or_ho_khi = (d_bcrec[2].hi(2) == BCType::ext_dir) ||
                                    (d_bcrec[2].hi(2) == BCType::hoextrap);

            if (flag(i,j,k).isConnected(0,0,-1))
            {
               Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
               Real yf = fcz(i,j,k,1);

               Real delta_x = xf  - ccc(i,j,k,0);
               Real delta_y = yf  - ccc(i,j,k,1);
               Real delta_z = 0.5 + ccc(i,j,k,2);

               const Real vcc_mns = vcc(i,j,k-1,2);
               const Real vcc_pls = vcc(i,j,k,2);

               Real cc_wmax = amrex::max(vcc_pls, vcc_mns);
               Real cc_wmin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "2" of vcc
               const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,2,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

               Real wpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1]
                                   - delta_z * slopes_eb_hi[2];

               wpls = amrex::max(amrex::min(wpls, cc_wmax), cc_wmin);

               delta_x = xf  - ccc(i,j,k-1,0);
               delta_y = yf  - ccc(i,j,k-1,1);
               delta_z = 0.5 - ccc(i,j,k-1,2);

               // Compute slopes of component "2" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j,k-1,2,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

               Real wmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];

               wmns = amrex::max(amrex::min(wmns, cc_wmax), cc_wmin);

               HydroBC::SetZEdgeBCs(i, j, k, 2, vcc, wmns, wpls, d_bcrec[2].lo(2), domain_klo, d_bcrec[2].hi(2), domain_khi, true);

               if ( (k==domain_klo) && (d_bcrec[2].lo(2) == BCType::foextrap || d_bcrec[2].lo(2) == BCType::hoextrap) )
               {
                   wpls = amrex::min(wpls,0.0_rt);
                   wmns = wpls;
               }
               if ( (k==domain_khi+1) && (d_bcrec[2].hi(2) == BCType::foextrap || d_bcrec[2].hi(2) == BCType::hoextrap) )
               {
                    wmns = amrex::max(wmns,0.0_rt);
                    wpls = wmns;
               }

               if ( wmns >= 0.0 || wpls <= 0.0_rt ) {
                  Real avg = 0.5 * ( wpls + wmns );

                  if (avg >= small_vel) {
                    w_val = wmns;
                  }
                  else if (avg <= -small_vel) {
                    w_val = wpls;
                  }
               }

                if (k == domain_klo && (d_bcrec[2].lo(2) == BCType::ext_dir)) {
                    w_val = vcc_mns;
                }
                else if (k == domain_khi+1 && (d_bcrec[2].hi(2) == BCType::ext_dir)) {
                    w_val = vcc_pls;
                }
            }

            w(i,j,k) = w_val;
        });
    }
    else
    {
        amrex::ParallelFor(Box(wbx),
        [w,vcc,flag,AMREX_D_DECL(fcx,fcy,fcz),ccc,vfrac,order,d_bcrec,domain_klo,domain_khi]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real w_val(0);

            if (flag(i,j,k).isConnected(0,0,-1))
            {
               Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
               Real yf = fcz(i,j,k,1);

               Real delta_x = xf  - ccc(i,j,k,0);
               Real delta_y = yf  - ccc(i,j,k,1);
               Real delta_z = 0.5 + ccc(i,j,k,2);

               const Real vcc_mns = vcc(i,j,k-1,2);
               const Real vcc_pls = vcc(i,j,k,2);

               Real cc_wmax = amrex::max(vcc_pls, vcc_mns);
               Real cc_wmin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "2" of vcc
               const auto slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,2,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

               Real wpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1]
                                   - delta_z * slopes_eb_hi[2];

               wpls = amrex::max(amrex::min(wpls, cc_wmax), cc_wmin);

               delta_x = xf  - ccc(i,j,k-1,0);
               delta_y = yf  - ccc(i,j,k-1,1);
               delta_z = 0.5 - ccc(i,j,k-1,2);

               // Compute slopes of component "2" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j,k-1,2,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

               Real wmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];

               wmns = amrex::max(amrex::min(wmns, cc_wmax), cc_wmin);

               HydroBC::SetZEdgeBCs(i, j, k, 2, vcc, wmns, wpls, d_bcrec[2].lo(2), domain_klo, d_bcrec[2].hi(2), domain_khi, true);

               if ( (k==domain_klo) && (d_bcrec[2].lo(2) == BCType::foextrap || d_bcrec[2].lo(2) == BCType::hoextrap) )
               {
                   wpls = amrex::min(wpls,0.0_rt);
                   wmns = wpls;
               }
               if ( (k==domain_khi+1) && (d_bcrec[2].hi(2) == BCType::foextrap || d_bcrec[2].hi(2) == BCType::hoextrap) )
               {
                    wmns = amrex::max(wmns,0.0_rt);
                    wpls = wmns;
               }

               if ( wmns >= 0.0 || wpls <= 0.0_rt ) {
                  Real avg = 0.5 * ( wpls + wmns );

                  if (avg >= small_vel) {
                    w_val = wmns;
                  }
                  else if (avg <= -small_vel) {
                    w_val = wpls;
                  }
               }
            }

            w(i,j,k) = w_val;
        });
    }
#endif
}